

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeSorterExtendFile(sqlite3 *db,sqlite3_file *pFd,i64 nByte)

{
  long in_RDX;
  sqlite3_file *in_RSI;
  long in_RDI;
  int chunksize;
  void *p;
  undefined4 in_stack_ffffffffffffffd8;
  int op;
  sqlite3_file *id;
  
  if ((in_RDX <= *(int *)(in_RDI + 0xac)) && (2 < in_RSI->pMethods->iVersion)) {
    id = (sqlite3_file *)0x0;
    op = 0x1000;
    sqlite3OsFileControlHint((sqlite3_file *)0x0,0x1000,(void *)0x177c6b);
    sqlite3OsFileControlHint(id,op,(void *)0x177c7f);
    sqlite3OsFetch(in_RSI,in_RDX,(int)((ulong)id >> 0x20),
                   (void **)CONCAT44(op,in_stack_ffffffffffffffd8));
    sqlite3OsUnfetch(id,CONCAT44(op,in_stack_ffffffffffffffd8),(void *)0x177cac);
  }
  return;
}

Assistant:

static void vdbeSorterExtendFile(sqlite3 *db, sqlite3_file *pFd, i64 nByte){
  if( nByte<=(i64)(db->nMaxSorterMmap) && pFd->pMethods->iVersion>=3 ){
    void *p = 0;
    int chunksize = 4*1024;
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_CHUNK_SIZE, &chunksize);
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_SIZE_HINT, &nByte);
    sqlite3OsFetch(pFd, 0, (int)nByte, &p);
    sqlite3OsUnfetch(pFd, 0, p);
  }
}